

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall ArgTest_StringArg_Test::TestBody(ArgTest_StringArg_Test *this)

{
  MockSpec<test_result_(const_char_*)> *this_00;
  size_t sVar1;
  MockSpec<test_result_(fmt::v5::basic_string_view<char>)> *this_01;
  basic_string_view<char> value;
  char str_data [5];
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<const_char_*>_> visitor;
  allocator local_121;
  char local_120 [8];
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_118;
  undefined4 local_108;
  longlong local_f8;
  size_t sStack_f0;
  StrictMock<mock_visitor<const_char_*>_> local_d8;
  
  builtin_strncpy(local_120,"test",5);
  testing::StrictMock<mock_visitor<const_char_*>_>::StrictMock(&local_d8);
  testing::Matcher<const_char_*>::Matcher((Matcher<const_char_*> *)&local_118.string,local_120);
  this_00 = mock_visitor<const_char_*>::gmock_visit
                      (&local_d8.super_mock_visitor<const_char_*>,
                       (Matcher<const_char_*> *)&local_118.string);
  testing::internal::MockSpec<test_result_(const_char_*)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x161,"visitor","visit(cstr)");
  testing::internal::MatcherBase<const_char_*>::~MatcherBase
            ((MatcherBase<const_char_*> *)&local_118.string);
  local_108 = 10;
  local_118.string.value = local_120;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<char_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d8,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_118.string);
  testing::StrictMock<mock_visitor<const_char_*>_>::~StrictMock(&local_d8);
  sVar1 = strlen(local_120);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_>::StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *)&local_d8);
  value.size_ = sVar1;
  value.data_ = local_120;
  testing::Matcher<fmt::v5::basic_string_view<char>_>::Matcher
            ((Matcher<fmt::v5::basic_string_view<char>_> *)&local_118.string,value);
  this_01 = mock_visitor<fmt::v5::basic_string_view<char>_>::gmock_visit
                      ((mock_visitor<fmt::v5::basic_string_view<char>_> *)
                       &local_d8.super_mock_visitor<const_char_*>,
                       (Matcher<fmt::v5::basic_string_view<char>_> *)&local_118.string);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<char>)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x164,"visitor","visit(sref)");
  testing::internal::MatcherBase<fmt::v5::basic_string_view<char>_>::~MatcherBase
            ((MatcherBase<fmt::v5::basic_string_view<char>_> *)&local_118.string);
  std::__cxx11::string::string((string *)&local_f8,local_120,&local_121);
  local_108 = 0xb;
  local_118.long_long_value = local_f8;
  local_118.string.size = sStack_f0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *)&local_d8,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_118.string);
  std::__cxx11::string::~string((string *)&local_f8);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_>::~StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<char>_>_> *)&local_d8);
  return;
}

Assistant:

TEST(ArgTest, StringArg) {
  char str_data[] = "test";
  char *str = str_data;
  const char *cstr = str;
  CHECK_ARG_(char, cstr, str);

  string_view sref(str);
  CHECK_ARG_(char, sref, std::string(str));
}